

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ssize_t __thiscall google::LogSink::send(LogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  tm *ptVar2;
  undefined4 extraout_var;
  LogMessageTime *in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  LogMessageTime *time_local;
  int line_local;
  char *base_filename_local;
  char *full_filename_local;
  LogSeverity severity_local;
  LogSink *this_local;
  
  ptVar2 = LogMessageTime::tm(in_R9);
  iVar1 = (*this->_vptr_LogSink[3])
                    (this,(ulong)(uint)__fd,__buf,__n,(ulong)(uint)__flags,ptVar2,in_stack_00000008,
                     in_stack_00000010);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void LogSink::send(LogSeverity severity, const char* full_filename,
                   const char* base_filename, int line,
                   const LogMessageTime& time, const char* message,
                   size_t message_len) {
#if defined(__GNUG__)
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#elif defined(_MSC_VER)
#  pragma warning(push)
#  pragma warning(disable : 4996)
#endif  // __GNUG__
  send(severity, full_filename, base_filename, line, &time.tm(), message,
       message_len);
#if defined(__GNUG__)
#  pragma GCC diagnostic pop
#elif defined(_MSC_VER)
#  pragma warning(pop)
#endif  // __GNUG__
}